

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O1

void __thiscall
hrgls::StreamProperties::StreamProperties(StreamProperties *this,StreamProperties *copy)

{
  element_type *peVar1;
  element_type *peVar2;
  StreamProperties_private *__p;
  _Rb_tree_header *p_Var3;
  
  (this->m_private).
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_private).
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (StreamProperties_private *)operator_new(0x40);
  p_Var3 = &(__p->m_status)._M_t._M_impl.super__Rb_tree_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__p->m_status)._M_t._M_impl = 0;
  *(undefined8 *)&(__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>::
  reset<hrgls::StreamProperties::StreamProperties_private>
            ((__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
              *)this,__p);
  peVar1 = (copy->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (peVar2->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->m_state).
              super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(peVar1->m_state).
              super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::operator=(&(peVar2->m_status)._M_t,&(peVar1->m_status)._M_t);
  return;
}

Assistant:

StreamProperties::StreamProperties(const StreamProperties& copy)
  {
    m_private.reset(new StreamProperties_private());
    *m_private = *copy.m_private;
  }